

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_getenviron(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long *plVar1;
  JSAtom prop;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *__s;
  JSValue JVar6;
  JSValue val;
  JSValueUnion local_40;
  int64_t local_38;
  
  JVar6 = JS_NewObject(ctx);
  plVar1 = _environ;
  if ((uint)JVar6.tag == 6) {
LAB_0011083c:
    uVar5 = 0;
    uVar4 = 0;
    local_38 = 6;
  }
  else {
    __s = (char *)*_environ;
    local_40 = JVar6.u;
    local_38 = JVar6.tag;
    if (__s != (char *)0x0) {
      uVar5 = 1;
      do {
        pcVar3 = strchr(__s,0x3d);
        if (pcVar3 != (char *)0x0) {
          prop = JS_NewAtomLen(ctx,__s,(long)pcVar3 - (long)__s);
          if (prop != 0) {
            val = JS_NewString(ctx,pcVar3 + 1);
            iVar2 = JS_DefinePropertyValue(ctx,JVar6,prop,val,7);
            JS_FreeAtom(ctx,prop);
            if (-1 < iVar2) goto LAB_001108d8;
          }
          if (0xfffffff4 < (uint)JVar6.tag) {
            iVar2 = *local_40.ptr;
            *(int *)local_40.ptr = iVar2 + -1;
            if (iVar2 < 2) {
              __JS_FreeValue(ctx,JVar6);
            }
          }
          goto LAB_0011083c;
        }
LAB_001108d8:
        __s = (char *)plVar1[uVar5];
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (__s != (char *)0x0);
    }
    uVar4 = (ulong)local_40.ptr & 0xffffffff00000000;
    uVar5 = (ulong)local_40.ptr & 0xffffffff;
  }
  JVar6.u.ptr = (void *)(uVar5 | uVar4);
  JVar6.tag = local_38;
  return JVar6;
}

Assistant:

static JSValue js_std_getenviron(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    char **envp;
    const char *name, *p, *value;
    JSValue obj;
    uint32_t idx;
    size_t name_len;
    JSAtom atom;
    int ret;

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    envp = environ;
    for(idx = 0; envp[idx] != NULL; idx++) {
        name = envp[idx];
        p = strchr(name, '=');
        name_len = p - name;
        if (!p)
            continue;
        value = p + 1;
        atom = JS_NewAtomLen(ctx, name, name_len);
        if (atom == JS_ATOM_NULL)
            goto fail;
        ret = JS_DefinePropertyValue(ctx, obj, atom, JS_NewString(ctx, value),
                                     JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}